

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::xml_document::reset(xml_document *this,xml_document *proto)

{
  unspecified_bool_type p_Var1;
  xml_node local_20;
  xml_node cur;
  xml_document *proto_local;
  xml_document *this_local;
  
  cur._root = (xml_node_struct *)proto;
  reset(this);
  local_20 = xml_node::first_child(cur._root);
  while( true ) {
    p_Var1 = xml_node::operator_cast_to_function_pointer(&local_20);
    if (p_Var1 == (unspecified_bool_type)0x0) break;
    xml_node::append_copy(&this->super_xml_node,&local_20);
    local_20 = xml_node::next_sibling(&local_20);
  }
  return;
}

Assistant:

PUGI__FN void xml_document::reset(const xml_document& proto)
	{
		reset();

		for (xml_node cur = proto.first_child(); cur; cur = cur.next_sibling())
			append_copy(cur);
	}